

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.h
# Opt level: O1

void __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::~SPxWeightST(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  ~SPxWeightST(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

virtual ~SPxWeightST()
   {
      weight   = nullptr;
      coWeight = nullptr;
   }